

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

int __thiscall
Fl_Tree::select(Fl_Tree *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
               timeval *__timeout)

{
  uint *puVar1;
  undefined4 in_register_00000034;
  Fl_Tree_Item *pFVar2;
  
  pFVar2 = (Fl_Tree_Item *)CONCAT44(in_register_00000034,__nfds);
  if (pFVar2->_selected != '\0') {
    return 0;
  }
  pFVar2->_selected = '\x01';
  puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if ((int)__readfds != 0) {
    this->_callback_reason = FL_TREE_REASON_SELECTED;
    this->_callback_item = pFVar2;
    Fl_Widget::do_callback
              ((Fl_Widget *)this,(Fl_Widget *)this,(this->super_Fl_Group).super_Fl_Widget.user_data_
              );
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return 1;
}

Assistant:

int Fl_Tree::select(Fl_Tree_Item *item, int docallback) {
  int alreadySelected = item->is_selected();
  if ( !alreadySelected ) {
    item->select();
    set_changed();
    if ( docallback ) {
      do_callback_for_item(item, FL_TREE_REASON_SELECTED);
    }
    redraw();
    return(1);
  }
#if FLTK_ABI_VERSION >= 10301
  // NEW
  if ( alreadySelected ) {
    if ( (item_reselect_mode() == FL_TREE_SELECTABLE_ALWAYS) && docallback ) {
      do_callback_for_item(item, FL_TREE_REASON_RESELECTED);
    }
  }
#endif /*FLTK_ABI_VERSION*/
  return(0);
}